

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

uint32 __thiscall Js::JavascriptStackWalker::GetByteCodeOffset(JavascriptStackWalker *this)

{
  uint in_EAX;
  uint uVar1;
  uint32 uVar2;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  uVar2 = 0;
  if (((*(ushort *)&this->field_0x50 & 4) == 0 & ((byte)*(ushort *)&this->field_0x50 ^ 1)) == 0) {
    if (((ByteCodeReader *)this->interpreterFrame == (ByteCodeReader *)0x0) ||
       ((this->lastInternalFrameInfo).codeAddress != (void *)0x0)) {
      TryGetByteCodeOffsetFromNativeFrame(this,(uint32 *)((long)&uStack_18 + 4));
      uVar2 = uStack_18._4_4_;
    }
    else {
      uVar1 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this->interpreterFrame);
      uVar2 = uVar1 - 1;
      if (uVar1 == 0) {
        uVar2 = 0;
      }
    }
  }
  return uVar2;
}

Assistant:

uint32 JavascriptStackWalker::GetByteCodeOffset() const
    {
        uint32 offset = 0;
        if (this->IsJavascriptFrame())
        {
            if (this->interpreterFrame)
            {
                if (this->TryGetByteCodeOffsetFromInterpreterFrame(offset))
                {
                    return offset;
                }
            }

#if ENABLE_NATIVE_CODEGEN
            if (TryGetByteCodeOffsetFromNativeFrame(offset))
            {
                return offset;
            }
#endif
        }
        return offset;
    }